

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xinclude.c
# Opt level: O3

xmlNodePtr
xmlXIncludeCopyNode(xmlXIncludeCtxtPtr ctxt,xmlNodePtr elem,int copyChildren,xmlChar *targetBase)

{
  xmlElementType xVar1;
  xmlNodePtr node;
  int iVar2;
  _xmlNode *p_Var3;
  xmlXIncludeRefPtr pxVar4;
  xmlNodePtr copy;
  _xmlNode *copy_00;
  _xmlNode *p_Var5;
  xmlNodePtr cur;
  _xmlNode *parent;
  bool bVar6;
  _xmlNode *node_00;
  int local_4c;
  
  p_Var3 = elem;
  if ((copyChildren != 0) && (p_Var3 = elem->children, p_Var3 == (_xmlNode *)0x0)) {
    return (xmlNodePtr)0x0;
  }
  cur = (xmlNodePtr)0x0;
  p_Var5 = (_xmlNode *)0x0;
  local_4c = 0;
  parent = (xmlNodePtr)0x0;
LAB_001b80ef:
  do {
    bVar6 = local_4c == 0 && targetBase != (xmlChar *)0x0;
    do {
      node_00 = p_Var3;
      xVar1 = node_00->type;
      copy_00 = p_Var5;
      if ((xVar1 != XML_DTD_NODE) && (xVar1 != XML_DOCUMENT_NODE)) {
        if (((xVar1 == XML_ELEMENT_NODE) &&
            ((node_00->ns != (xmlNs *)0x0 &&
             (iVar2 = xmlStrEqual(node_00->name,(xmlChar *)"include"), iVar2 != 0)))) &&
           ((iVar2 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2003/XInclude"),
            iVar2 != 0 ||
            (iVar2 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XInclude"),
            iVar2 != 0)))) {
          pxVar4 = xmlXIncludeExpandNode(ctxt,node_00);
          if (pxVar4 == (xmlXIncludeRefPtr)0x0) {
LAB_001b8316:
            xmlFreeNodeList(cur);
            return (xmlNodePtr)0x0;
          }
          for (node = pxVar4->inc; node != (xmlNodePtr)0x0; node = node->next) {
            copy = xmlStaticCopyNode(node,ctxt->doc,parent,1);
            if (copy == (xmlNodePtr)0x0) goto LAB_001b82e9;
            if (cur == (xmlNodePtr)0x0) {
              cur = copy;
            }
            if (copy_00 == (_xmlNode *)0x0) {
              if (parent != (xmlNodePtr)0x0) {
                parent->children = copy;
              }
            }
            else {
              copy_00->next = copy;
              copy->prev = copy_00;
            }
            if (bVar6) {
              xmlXIncludeBaseFixup(ctxt,node,copy,targetBase);
            }
            copy_00 = copy;
          }
        }
        else {
          copy_00 = xmlStaticCopyNode(node_00,ctxt->doc,parent,2);
          if (copy_00 == (xmlNodePtr)0x0) {
LAB_001b82e9:
            ctxt->fatalErr = 1;
            ctxt->errNo = 2;
            ctxt->nbErrors = ctxt->nbErrors + 1;
            xmlRaiseMemoryError(ctxt->errorHandler,(xmlGenericErrorFunc)0x0,ctxt->errorCtxt,0xb,
                                (xmlError *)0x0);
            goto LAB_001b8316;
          }
          if (cur == (xmlNodePtr)0x0) {
            cur = copy_00;
          }
          if (p_Var5 == (_xmlNode *)0x0) {
            if (parent != (xmlNodePtr)0x0) {
              parent->children = copy_00;
            }
          }
          else {
            p_Var5->next = copy_00;
            copy_00->prev = p_Var5;
          }
          if (bVar6) {
            xmlXIncludeBaseFixup(ctxt,node_00,copy_00,targetBase);
          }
          if ((node_00->type != XML_ENTITY_REF_NODE) &&
             (p_Var3 = node_00->children, p_Var3 != (_xmlNode *)0x0)) {
            local_4c = local_4c + 1;
            p_Var5 = (_xmlNode *)0x0;
            parent = copy_00;
            goto LAB_001b80ef;
          }
        }
      }
      if (node_00 == elem) {
        return cur;
      }
      p_Var3 = node_00->next;
      p_Var5 = copy_00;
    } while (node_00->next != (_xmlNode *)0x0);
    do {
      p_Var5 = parent;
      if (p_Var5 != (_xmlNode *)0x0) {
        p_Var5->last = copy_00;
      }
      node_00 = node_00->parent;
      if (node_00 == elem) {
        return cur;
      }
      parent = p_Var5->parent;
      local_4c = local_4c + -1;
      p_Var3 = node_00->next;
      copy_00 = p_Var5;
    } while (p_Var3 == (_xmlNode *)0x0);
  } while( true );
}

Assistant:

static xmlNodePtr
xmlXIncludeCopyNode(xmlXIncludeCtxtPtr ctxt, xmlNodePtr elem,
                    int copyChildren, const xmlChar *targetBase) {
    xmlNodePtr result = NULL;
    xmlNodePtr insertParent = NULL;
    xmlNodePtr insertLast = NULL;
    xmlNodePtr cur;
    xmlNodePtr item;
    int depth = 0;

    if (copyChildren) {
        cur = elem->children;
        if (cur == NULL)
            return(NULL);
    } else {
        cur = elem;
    }

    while (1) {
        xmlNodePtr copy = NULL;
        int recurse = 0;

        if ((cur->type == XML_DOCUMENT_NODE) ||
            (cur->type == XML_DTD_NODE)) {
            ;
        } else if ((cur->type == XML_ELEMENT_NODE) &&
                   (cur->ns != NULL) &&
                   (xmlStrEqual(cur->name, XINCLUDE_NODE)) &&
                   ((xmlStrEqual(cur->ns->href, XINCLUDE_NS)) ||
                    (xmlStrEqual(cur->ns->href, XINCLUDE_OLD_NS)))) {
            xmlXIncludeRefPtr ref = xmlXIncludeExpandNode(ctxt, cur);

            if (ref == NULL)
                goto error;
            /*
             * TODO: Insert XML_XINCLUDE_START and XML_XINCLUDE_END nodes
             */
            for (item = ref->inc; item != NULL; item = item->next) {
                copy = xmlStaticCopyNode(item, ctxt->doc, insertParent, 1);
                if (copy == NULL) {
                    xmlXIncludeErrMemory(ctxt);
                    goto error;
                }

                if (result == NULL)
                    result = copy;
                if (insertLast != NULL) {
                    insertLast->next = copy;
                    copy->prev = insertLast;
                } else if (insertParent != NULL) {
                    insertParent->children = copy;
                }
                insertLast = copy;

                if ((depth == 0) && (targetBase != NULL))
                    xmlXIncludeBaseFixup(ctxt, item, copy, targetBase);
            }
        } else {
            copy = xmlStaticCopyNode(cur, ctxt->doc, insertParent, 2);
            if (copy == NULL) {
                xmlXIncludeErrMemory(ctxt);
                goto error;
            }

            if (result == NULL)
                result = copy;
            if (insertLast != NULL) {
                insertLast->next = copy;
                copy->prev = insertLast;
            } else if (insertParent != NULL) {
                insertParent->children = copy;
            }
            insertLast = copy;

            if ((depth == 0) && (targetBase != NULL))
                xmlXIncludeBaseFixup(ctxt, cur, copy, targetBase);

            recurse = (cur->type != XML_ENTITY_REF_NODE) &&
                      (cur->children != NULL);
        }

        if (recurse) {
            cur = cur->children;
            insertParent = insertLast;
            insertLast = NULL;
            depth += 1;
            continue;
        }

        if (cur == elem)
            return(result);

        while (cur->next == NULL) {
            if (insertParent != NULL)
                insertParent->last = insertLast;
            cur = cur->parent;
            if (cur == elem)
                return(result);
            insertLast = insertParent;
            insertParent = insertParent->parent;
            depth -= 1;
        }

        cur = cur->next;
    }

error:
    xmlFreeNodeList(result);
    return(NULL);
}